

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxchangebasis.hpp
# Opt level: O0

void __thiscall soplex::SPxBasisBase<double>::invalidate(SPxBasisBase<double> *this)

{
  Verbosity VVar1;
  _func_ostream_ptr_ostream_ptr *in_RDI;
  Verbosity old_verbosity;
  undefined4 uVar2;
  
  if ((((((byte)in_RDI[0x50] & 1) != 0) || (((byte)in_RDI[0x40] & 1) != 0)) &&
      (*(long *)(in_RDI + 0x118) != 0)) &&
     (VVar1 = SPxOut::getVerbosity(*(SPxOut **)(in_RDI + 0x118)), 4 < (int)VVar1)) {
    VVar1 = SPxOut::getVerbosity(*(SPxOut **)(in_RDI + 0x118));
    uVar2 = 5;
    (**(code **)(**(long **)(in_RDI + 0x118) + 0x10))
              (*(long **)(in_RDI + 0x118),&stack0xfffffffffffffff0);
    soplex::operator<<((SPxOut *)CONCAT44(VVar1,uVar2),(char *)in_RDI);
    soplex::operator<<((SPxOut *)CONCAT44(VVar1,uVar2),in_RDI);
    (**(code **)(**(long **)(in_RDI + 0x118) + 0x10))
              (*(long **)(in_RDI + 0x118),&stack0xfffffffffffffff4);
  }
  in_RDI[0x50] = (code)0x0;
  in_RDI[0x40] = (code)0x0;
  return;
}

Assistant:

void SPxBasisBase<R>::invalidate()
{
   if(factorized || matrixIsSetup)
   {
      SPX_MSG_INFO3((*this->spxout),
                    (*this->spxout) << "ICHBAS09 explicit invalidation of factorization" <<
                    std::endl;)
   }

   factorized    = false;
   matrixIsSetup = false;
}